

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

expr_node * __thiscall expr_tree::sqrtDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *peVar1;
  expr_node *peVar2;
  expr_value eStack_28;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,4);
  expr_node::expr_node(this_00,'\x05',&eStack_28);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,1);
  expr_node::expr_node(peVar1,'\x01',&eStack_28,this_00,(expr_node *)0x0,(expr_node *)0x0);
  this_00->left = peVar1;
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,3);
  expr_node::expr_node(peVar1,'\x05',&eStack_28,this_00,(expr_node *)0x0,(expr_node *)0x0);
  this_00->right = peVar1;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_28,2);
  expr_node::expr_node(peVar2,'\x01',&eStack_28);
  peVar1->left = peVar2;
  peVar2 = Copy(node);
  peVar1->right = peVar2;
  Link(peVar1,peVar1->left,peVar2);
  Link(this_00,this_00->left,this_00->right);
  return this_00;
}

Assistant:

expr_node* expr_tree::sqrtDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)DIV);
    deriv->left = new expr_node(INT, (long)1, deriv, nullptr, nullptr);
    deriv->right = new expr_node(OP, (long)MUL, deriv, nullptr, nullptr);
    expr_node* denum = deriv->right;
    denum->left = new expr_node(INT, (long)2);
    denum->right = Copy(node);
    Link(denum, denum->left, denum->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}